

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

string * __thiscall
cfd::core::Script::ToString_abi_cxx11_(string *__return_storage_ptr__,Script *this)

{
  pointer pSVar1;
  pointer this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  undefined1 local_1c0 [16];
  ostringstream *local_1b0;
  char *local_1a8;
  ostringstream os;
  
  this_00 = (this->script_stack_).
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->script_stack_).
           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == pSVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&os);
  }
  else {
    str_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    str_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    str_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; this_00 != pSVar1; this_00 = this_00 + 1) {
      ScriptElement::ToString_abi_cxx11_((string *)&os,this_00);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&str_list,
                 (string *)&os);
      ::std::__cxx11::string::~string((string *)&os);
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    local_1a8 = " ";
    local_1b0 = (ostringstream *)&os;
    ::std::
    copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )str_list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                *)str_list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&str_list);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Script::ToString() const {
  if (script_stack_.empty()) {
    return "";
  }

  std::vector<std::string> str_list;
  for (const ScriptElement& element : script_stack_) {
    str_list.push_back(element.ToString());
  }

  const char* delimiter = " ";
  std::ostringstream os;
  std::copy(
      str_list.begin(), str_list.end(),
      std::ostream_iterator<std::string>(os, delimiter));
  std::string result = os.str();  // "a,b,c,"
  result.erase(result.size() - std::char_traits<char>::length(delimiter));
  return result;
}